

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O3

void __thiscall
google::protobuf::StringPiece::StringPiece
          (StringPiece *this,StringPiece x,stringpiece_ssize_type pos)

{
  LogMessage *pLVar1;
  LogFinisher local_51;
  LogMessage local_50;
  
  this->ptr_ = x.ptr_ + pos;
  this->length_ = x.length_ - pos;
  if (pos < 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/stringpiece.cc"
               ,0x34);
    pLVar1 = internal::LogMessage::operator<<(&local_50,"CHECK failed: (0) <= (pos): ");
    internal::LogFinisher::operator=(&local_51,pLVar1);
    internal::LogMessage::~LogMessage(&local_50);
  }
  if (x.length_ < pos) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/stringpiece.cc"
               ,0x35);
    pLVar1 = internal::LogMessage::operator<<(&local_50,"CHECK failed: (pos) <= (x.length_): ");
    internal::LogFinisher::operator=(&local_51,pLVar1);
    internal::LogMessage::~LogMessage(&local_50);
  }
  return;
}

Assistant:

StringPiece::StringPiece(StringPiece x, stringpiece_ssize_type pos)
    : ptr_(x.ptr_ + pos), length_(x.length_ - pos) {
  GOOGLE_DCHECK_LE(0, pos);
  GOOGLE_DCHECK_LE(pos, x.length_);
}